

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::restore(uint argc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar2;
  long *plVar3;
  FILE *fp_00;
  CVmFile *pCVar4;
  int __oflag;
  int in_EDI;
  osfildef *fp;
  err_frame_t err_cur__;
  int err;
  CVmFile *file;
  CVmNetFile *netfile;
  vm_rcdesc rc;
  vm_val_t *filespec;
  undefined8 in_stack_fffffffffffffe78;
  void *pvVar5;
  CVmFile *in_stack_fffffffffffffe80;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffffe88;
  int idx;
  vm_bif_desc *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  vm_rcdesc *in_stack_fffffffffffffea0;
  uint local_150 [2];
  undefined8 local_148;
  void *local_140;
  __jmp_buf_tag _Stack_138;
  int local_6c;
  CVmFile *local_68;
  CVmNetFile *local_60;
  undefined1 local_58 [72];
  vm_val_t *local_10;
  int local_4;
  
  idx = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  iVar1 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_4 = in_EDI;
  CVmBif::check_argc(0,0x2f97ff);
  local_10 = CVmStack::get(0);
  CVmStack::get(0);
  vm_rcdesc::vm_rcdesc
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,idx,
             (vm_val_t *)in_stack_fffffffffffffe80,iVar1);
  __oflag = (int)local_58;
  iVar1 = CVmNetFile::open((char *)local_10,__oflag,1,0xf,"application/x-t3vm-state");
  local_60 = (CVmNetFile *)CONCAT44(extraout_var,iVar1);
  local_68 = (CVmFile *)0x0;
  local_6c = 0;
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  local_148 = *puVar2;
  plVar3 = (long *)_ZTW11G_err_frame();
  *plVar3 = (long)local_150;
  local_150[0] = _setjmp(&_Stack_138);
  if (local_150[0] == 0) {
    CVmObjFile::check_safety_for_open((CVmNetFile *)in_stack_fffffffffffffe90,idx);
    fp_00 = fopen(local_60->lclfname,"rb");
    if (fp_00 == (FILE *)0x0) {
      err_throw(0);
    }
    pCVar4 = (CVmFile *)operator_new(0x10);
    CVmFile::CVmFile(pCVar4,(osfildef *)fp_00,0);
    __oflag = (int)fp_00;
    local_68 = pCVar4;
    local_6c = CVmSaveFile::restore((CVmFile *)err_cur__._0_8_);
    if (local_6c != 0) {
      err_throw(0);
    }
    local_6c = 0;
  }
  if ((local_150[0] & 0x8000) == 0) {
    local_150[0] = local_150[0] | 0x8000;
    if ((local_68 != (CVmFile *)0x0) && (local_68 != (CVmFile *)0x0)) {
      pCVar4 = local_68;
      CVmFile::~CVmFile(in_stack_fffffffffffffe80);
      __oflag = 0x10;
      operator_delete(pCVar4,0x10);
    }
    if (local_60 != (CVmNetFile *)0x0) {
      CVmNetFile::close(local_60,__oflag);
    }
  }
  uVar6 = local_148;
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  *puVar2 = uVar6;
  if ((local_150[0] & 0x4001) != 0) {
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar2 & 2) != 0) {
      plVar3 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar3 + 0x10));
    }
    pvVar5 = local_140;
    plVar3 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar3 + 0x10) = pvVar5;
    err_rethrow();
  }
  if ((local_150[0] & 2) != 0) {
    free(local_140);
  }
  CVmStack::discard(local_4);
  CVmBif::retval_nil();
  return;
}

Assistant:

check_argc(vmg_ argc, 1);

    /* get the filename or spec */
    const vm_val_t *filespec = G_stk->get(0);

    /* set up for network storage server access, if applicable */
    vm_rcdesc rc(vmg_ "restoreGame", bif_table, 16, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmNetFile::open(
        vmg_ filespec, &rc, NETF_READ, OSFTT3SAV, "application/x-t3vm-state");

    /* open the file and restore the game */
    CVmFile *file = 0;
    int err = 0;
    err_try
    {
        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ netfile, VMOBJFILE_ACCESS_READ);

        /* open the file */
        osfildef *fp = osfoprb(netfile->lclfname, OSFTT3SAV);
        if (fp == 0)
            err_throw(VMERR_FILE_NOT_FOUND);

        /* set up the file reader */
        file = new CVmFile(fp, 0);

        /* restore the state; throw an exception on error */
        if ((err = CVmSaveFile::restore(vmg_ file)) != 0)
            err_throw(err);
    }
    err_finally
    {
        /* close our local file */
        if (file != 0)
            delete file;

        /* close the network file */
        if (netfile != 0)
            netfile->close(vmg0_);
    }
    err_end;

    /* discard arguments */
    G_stk->discard(argc);

    /* no return value */
    retval_nil(vmg0_);
}

/*
 *   restart
 */
void CVmBifTADS::restart(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 0);

    /* reset the VM to the image file's initial state */
    CVmSaveFile::reset(vmg0_);

    /* no return value */
    retval_nil(vmg0_);
}